

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O2

int32_t icu_63::hashPartialLocationKey(UHashTok key)

{
  char16_t srcChar;
  int32_t iVar1;
  UnicodeString *pUVar2;
  ConstChar16Ptr local_68;
  char16_t *local_60;
  UnicodeString str;
  
  UnicodeString::UnicodeString(&str,*key.pointer);
  pUVar2 = UnicodeString::append(&str,L'&');
  local_68.p_ = *(char16_t **)((long)key.pointer + 8);
  pUVar2 = UnicodeString::append(pUVar2,&local_68,-1);
  pUVar2 = UnicodeString::append(pUVar2,L'#');
  srcChar = L'L';
  if (*(char *)((long)key.pointer + 0x10) == '\0') {
    srcChar = L'S';
  }
  UnicodeString::append(pUVar2,srcChar);
  local_60 = local_68.p_;
  iVar1 = UnicodeString::doHashCode(&str);
  UnicodeString::~UnicodeString(&str);
  return iVar1;
}

Assistant:

static int32_t U_CALLCONV
hashPartialLocationKey(const UHashTok key) {
    // <tzID>&<mzID>#[L|S]
    PartialLocationKey *p = (PartialLocationKey *)key.pointer;
    UnicodeString str(p->tzID);
    str.append((UChar)0x26)
        .append(p->mzID, -1)
        .append((UChar)0x23)
        .append((UChar)(p->isLong ? 0x4C : 0x53));
    return str.hashCode();
}